

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-debug.c
# Opt level: O0

void print_data(coda_cursor *cursor,int compound_newline)

{
  int iVar1;
  undefined8 local_188;
  double im;
  double re;
  char str [27];
  double data_9;
  double data_8;
  undefined8 uStack_140;
  coda_special_type special_type;
  double data_7;
  char s_1 [21];
  uint64_t data_6;
  char s [21];
  int64_t data_5;
  uint32_t data_4;
  int32_t data_3;
  uint8_t *data_2;
  int64_t byte_size;
  int64_t bit_size;
  char *data_1;
  long length;
  int local_c0;
  int iStack_bc;
  char data;
  coda_native_type read_type;
  int i_1;
  long num_elements;
  int num_dims;
  long dim [8];
  int local_5c;
  undefined8 uStack_58;
  int hidden;
  char *field_name_1;
  undefined8 uStack_48;
  int first_field;
  char *field_name;
  long i;
  undefined8 uStack_30;
  int is_union;
  coda_type *record_type;
  long num_fields;
  undefined4 local_18;
  int has_attributes;
  coda_type_class type_class;
  int compound_newline_local;
  coda_cursor *cursor_local;
  
  num_fields._4_4_ = 0;
  has_attributes = compound_newline;
  _type_class = cursor;
  if (show_attributes != 0) {
    iVar1 = coda_cursor_has_attributes(cursor,(long)&num_fields + 4);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (num_fields._4_4_ != 0) {
      if (has_attributes != 0) {
        ff_printf("\n");
        indent();
      }
      ff_printf("attr: ");
      iVar1 = coda_cursor_goto_attributes(_type_class);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      INDENT = INDENT + 1;
      print_data(_type_class,1);
      INDENT = INDENT + -1;
      coda_cursor_goto_parent(_type_class);
      fi_printf("data: ");
      INDENT = INDENT + 1;
    }
  }
  iVar1 = coda_cursor_get_type_class(_type_class,&local_18);
  if (iVar1 != 0) {
    handle_coda_error();
  }
  switch(local_18) {
  case 0:
    iVar1 = coda_cursor_get_num_elements(_type_class,&record_type);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if ((long)record_type < 1) {
      ff_printf("{}\n");
    }
    else {
      if (has_attributes != 0) {
        ff_printf("\n");
      }
      iVar1 = coda_cursor_get_type(_type_class,&stack0xffffffffffffffd0);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      iVar1 = coda_type_get_record_union_status(uStack_30,(long)&i + 4);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      if (i._4_4_ == 0) {
        field_name_1._4_4_ = 1;
        iVar1 = coda_cursor_goto_first_record_field(_type_class);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        for (field_name = (char *)0x0; (long)field_name < (long)record_type;
            field_name = field_name + 1) {
          iVar1 = coda_type_get_record_field_hidden_status(uStack_30,field_name,&local_5c);
          if (iVar1 != 0) {
            handle_coda_error();
          }
          if (local_5c == 0) {
            iVar1 = coda_type_get_record_field_name(uStack_30,field_name,&stack0xffffffffffffffa8);
            if (iVar1 != 0) {
              handle_coda_error();
            }
            if ((has_attributes != 0) || (field_name_1._4_4_ == 0)) {
              indent();
            }
            if (field_name_1._4_4_ != 0) {
              field_name_1._4_4_ = 0;
            }
            ff_printf("%s: ",uStack_58);
            INDENT = INDENT + 1;
            print_data(_type_class,1);
            INDENT = INDENT + -1;
          }
          if (((long)field_name < (long)(record_type + -1)) &&
             (iVar1 = coda_cursor_goto_next_record_field(_type_class), iVar1 != 0)) {
            handle_coda_error();
          }
        }
        coda_cursor_goto_parent(_type_class);
      }
      else {
        iVar1 = coda_cursor_get_available_union_field_index(_type_class,&field_name);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        iVar1 = coda_type_get_record_field_name(uStack_30,field_name,&stack0xffffffffffffffb8);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        iVar1 = coda_cursor_goto_record_field_by_index(_type_class,field_name);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        if (has_attributes != 0) {
          indent();
        }
        ff_printf("%s: ",uStack_48);
        INDENT = INDENT + 1;
        print_data(_type_class,1);
        INDENT = INDENT + -1;
        coda_cursor_goto_parent(_type_class);
      }
    }
    break;
  case 1:
    iVar1 = coda_cursor_get_array_dim(_type_class,(long)&num_elements + 4,&stack0xffffffffffffff58);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (num_elements._4_4_ < 0) {
      ff_printf("[]\n");
    }
    else {
      _read_type = 1;
      for (iStack_bc = 0; iStack_bc < num_elements._4_4_; iStack_bc = iStack_bc + 1) {
        _read_type = dim[(long)iStack_bc + -1] * _read_type;
      }
      if (_read_type < 1) {
        ff_printf("[]\n");
      }
      else {
        ff_printf("\n");
        iVar1 = coda_cursor_goto_first_array_element(_type_class);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        for (iStack_bc = 0; iStack_bc < _read_type; iStack_bc = iStack_bc + 1) {
          fi_printf("- ");
          INDENT = INDENT + 1;
          print_data(_type_class,0);
          INDENT = INDENT + -1;
          if (((long)iStack_bc < _read_type + -1) &&
             (iVar1 = coda_cursor_goto_next_array_element(_type_class), iVar1 != 0)) {
            handle_coda_error();
          }
        }
        coda_cursor_goto_parent(_type_class);
      }
    }
    break;
  case 2:
  case 3:
  case 4:
  case 5:
    iVar1 = coda_cursor_get_read_type(_type_class,&local_c0);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    switch(local_c0) {
    case 0:
    case 2:
    case 4:
      iVar1 = coda_cursor_read_int32(_type_class,(long)&data_5 + 4);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("%ld\n",(long)data_5._4_4_);
      break;
    case 1:
    case 3:
    case 5:
      iVar1 = coda_cursor_read_uint32(_type_class,&data_5);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("%lu\n",(ulong)(uint)data_5);
      break;
    case 6:
      iVar1 = coda_cursor_read_int64(_type_class,s + 0x10);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      coda_str64(stack0xffffffffffffff00,&data_6);
      ff_printf("%s\n",&data_6);
      break;
    case 7:
      iVar1 = coda_cursor_read_uint64(_type_class,s_1 + 0x10);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      coda_str64u(stack0xfffffffffffffee0,&data_7);
      ff_printf("%s\n",&data_7);
      break;
    case 8:
    case 9:
      iVar1 = coda_cursor_read_double(_type_class,&stack0xfffffffffffffec0);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      if (local_c0 == 8) {
        ff_printf("%.7g\n",uStack_140);
      }
      else {
        ff_printf("%.16g\n",uStack_140);
      }
      break;
    case 10:
      iVar1 = coda_cursor_read_char(_type_class,(long)&length + 7);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped((char *)((long)&length + 7),1);
      ff_printf("\"\n");
      break;
    case 0xb:
      iVar1 = coda_cursor_get_string_length(_type_class,&data_1);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      bit_size = (int64_t)malloc((size_t)(data_1 + 1));
      if ((void *)bit_size == (void *)0x0) {
        coda_set_error(0xffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",data_1 + 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-yaml.c"
                       ,0x169);
        handle_coda_error();
      }
      iVar1 = coda_cursor_read_string(_type_class,bit_size,data_1 + 1);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped((char *)bit_size,(long)data_1);
      ff_printf("\"\n",data_1);
      free((void *)bit_size);
      break;
    case 0xc:
      iVar1 = coda_cursor_get_bit_size(_type_class,&byte_size);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      data_2 = (uint8_t *)((byte_size >> 3) + (long)(int)(uint)((byte_size & 7U) != 0));
      _data_4 = (char *)malloc((size_t)data_2);
      if (_data_4 == (char *)0x0) {
        coda_set_error(0xffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",data_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-yaml.c"
                       ,0x188);
        handle_coda_error();
      }
      iVar1 = coda_cursor_read_bits(_type_class,_data_4,0,byte_size);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped(_data_4,(long)data_2);
      ff_printf("\"\n");
      free(_data_4);
      break;
    case -1:
      ff_printf("null\n");
    }
    break;
  case 6:
    iVar1 = coda_cursor_get_special_type(_type_class,(long)&data_8 + 4);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    switch(data_8._4_4_) {
    case 0:
      ff_printf("null\n");
      break;
    case 1:
      iVar1 = coda_cursor_read_double(_type_class,&data_9);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("%.16g\n",data_9);
      break;
    case 2:
      iVar1 = coda_cursor_read_double(_type_class,str + 0x18);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      iVar1 = coda_isNaN(stack0xfffffffffffffea8);
      if ((iVar1 == 0) && (iVar1 = coda_isInf(stack0xfffffffffffffea8), iVar1 == 0)) {
        iVar1 = coda_time_double_to_string
                          (stack0xfffffffffffffea8,"yyyy-MM-dd\'T\'HH:mm:ss.SSSSSS",&re);
        if (iVar1 == 0) {
          ff_printf("%s\n",&re);
        }
        else {
          ff_printf("\"{--invalid time value--}\"");
        }
      }
      else {
        ff_printf("%.16g\n",stack0xfffffffffffffea8);
      }
      break;
    case 3:
      iVar1 = coda_cursor_read_complex_double_split(_type_class,&im,&local_188);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf("%g + %gi\n",im,local_188);
    }
  }
  if (num_fields._4_4_ != 0) {
    INDENT = INDENT + -1;
  }
  return;
}

Assistant:

static void print_data(coda_cursor *cursor, int depth)
{
    coda_type_class type_class;
    int has_attributes;

    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        handle_coda_error();
    }
    if (has_attributes)
    {
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            handle_coda_error();
        }
        fi_printf("{attributes}\n");
        INDENT++;
        print_data(cursor, depth);
        INDENT--;
        coda_cursor_goto_parent(cursor);
    }

    if (coda_cursor_get_type_class(cursor, &type_class) != 0)
    {
        handle_coda_error();
    }
    switch (type_class)
    {
        case coda_record_class:
            {
                long num_fields;

                if (coda_cursor_get_num_elements(cursor, &num_fields) != 0)
                {
                    handle_coda_error();
                }
                if (num_fields > 0)
                {
                    coda_type *record_type;
                    int is_union;
                    long i;

                    if (coda_cursor_get_type(cursor, &record_type) != 0)
                    {
                        handle_coda_error();
                    }

                    if (coda_type_get_record_union_status(record_type, &is_union) != 0)
                    {
                        handle_coda_error();
                    }
                    if (is_union)
                    {
                        const char *field_name;

                        if (coda_cursor_get_available_union_field_index(cursor, &i) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_cursor_goto_record_field_by_index(cursor, i) != 0)
                        {
                            handle_coda_error();
                        }
                        fi_printf("[%s]", field_name);
                        if (print_offsets)
                        {
                            int64_t offset;

                            if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                            {
                                handle_coda_error();
                            }
                            if (offset >= 0)
                            {
                                char s[21];

                                coda_str64(offset >> 3, s);
                                ff_printf(":%s", s);
                                if ((offset & 0x7) != 0)
                                {
                                    ff_printf(":%d", (int)(offset & 0x7));
                                }
                            }
                        }
                        ff_printf("\n");
                        INDENT++;
                        if (max_depth < 0 || depth < max_depth)
                        {
                            print_data(cursor, depth + 1);
                        }
                        else
                        {
                            fi_printf("...\n");
                        }
                        INDENT--;
                        coda_cursor_goto_parent(cursor);
                    }
                    else
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_fields; i++)
                        {
                            const char *field_name;

                            if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                            {
                                handle_coda_error();
                            }
                            fi_printf("[%s]", field_name);
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;
                            if (i < num_fields - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_array_class:
            {
                long dim[CODA_MAX_NUM_DIMS];
                int num_dims;
                long num_elements;

                if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
                {
                    handle_coda_error();
                }
                if (num_dims >= 0)
                {
                    int index[CODA_MAX_NUM_DIMS];
                    int i;

                    num_elements = 1;
                    for (i = 0; i < num_dims; i++)
                    {
                        num_elements *= dim[i];
                        index[i] = 0;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            int k;

                            fi_printf("(");
                            for (k = 0; k < num_dims; k++)
                            {
                                ff_printf("%d", index[k]);
                                if (k < num_dims - 1)
                                {
                                    ff_printf(",");
                                }
                            }
                            ff_printf(")");
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;

                            k = num_dims - 1;
                            while (k >= 0)
                            {
                                index[k]++;
                                if (index[k] == dim[k])
                                {
                                    index[k--] = 0;
                                }
                                else
                                {
                                    break;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_array_element(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_integer_class:
        case coda_real_class:
        case coda_text_class:
        case coda_raw_class:
            {
                coda_native_type read_type;
                int has_ascii_content;

                if (coda_cursor_has_ascii_content(cursor, &has_ascii_content) != 0)
                {
                    handle_coda_error();
                }
                if (has_ascii_content)
                {
                    long length;
                    char *data;

                    if (coda_cursor_get_string_length(cursor, &length) != 0)
                    {
                        handle_coda_error();
                    }
                    data = (char *)malloc(length + 1);
                    if (data == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                       "out of memory (could not allocate %lu bytes) (%s:%u)",
                                       (long)length + 1, __FILE__, __LINE__);
                        handle_coda_error();
                    }
                    if (coda_cursor_read_string(cursor, data, length + 1) != 0)
                    {
                        handle_coda_error();
                    }

                    fi_printf("\"");
                    print_escaped(data, length);
                    ff_printf("\" (length=%ld)\n", length);
                    free(data);
                }

                if (coda_cursor_get_read_type(cursor, &read_type) != 0)
                {
                    handle_coda_error();
                }
                switch (read_type)
                {
                    case coda_native_type_bytes:
                        {
                            int64_t bit_size;
                            int64_t byte_size;
                            uint8_t *data;
                            char s[21];

                            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
                            {
                                handle_coda_error();
                            }
                            byte_size = (bit_size >> 3) + (bit_size & 0x7 ? 1 : 0);
                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)byte_size, __FILE__, __LINE__);
                                handle_coda_error();
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, bit_size) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("\"");
                            print_escaped((char *)data, (long)byte_size);
                            ff_printf("\" (size=");
                            coda_str64(bit_size >> 3, s);
                            ff_printf("%s", s);
                            if ((bit_size & 0x7) != 0)
                            {
                                ff_printf(":%d", (int)(bit_size & 0x7));
                            }
                            ff_printf(")\n");

                            free(data);
                        }
                        break;
                    case coda_native_type_int8:
                    case coda_native_type_int16:
                    case coda_native_type_int32:
                        {
                            int32_t data;

                            if (coda_cursor_read_int32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%ld\n", (long)data);
                        }
                        break;
                    case coda_native_type_uint8:
                    case coda_native_type_uint16:
                    case coda_native_type_uint32:
                        {
                            uint32_t data;

                            if (coda_cursor_read_uint32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%lu\n", (unsigned long)data);
                        }
                        break;
                    case coda_native_type_int64:
                        {
                            int64_t data;
                            char s[21];

                            if (coda_cursor_read_int64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_uint64:
                        {
                            uint64_t data;
                            char s[21];

                            if (coda_cursor_read_uint64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64u(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_float:
                    case coda_native_type_double:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            if (read_type == coda_native_type_float)
                            {
                                fi_printf("%.7g\n", data);
                            }
                            else
                            {
                                fi_printf("%.16g\n", data);
                            }
                        }
                        break;
                    case coda_native_type_char:
                    case coda_native_type_string:
                    case coda_native_type_not_available:
                        assert(has_ascii_content);
                        break;
                }
            }
            break;
        case coda_special_class:
            {
                coda_special_type special_type;

                if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                {
                    handle_coda_error();
                }

                if (special_type != coda_special_no_data)
                {
                    coda_cursor base_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&base_cursor) != 0)
                    {
                        handle_coda_error();
                    }
                    print_data(&base_cursor, depth);
                }

                fi_printf("<%s>", coda_type_get_special_type_name(special_type));
                switch (special_type)
                {
                    case coda_special_no_data:
                        ff_printf("\n");
                        break;
                    case coda_special_vsf_integer:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf("%.16g\n", data);
                        }
                        break;
                    case coda_special_time:
                        {
                            double data;
                            char str[27];

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }
                            if (coda_isNaN(data) || coda_isInf(data))
                            {
                                ff_printf(" %.16g\n", data);
                            }
                            else
                            {
                                if (coda_time_double_to_string(data, "yyyy-MM-dd HH:mm:ss.SSSSSS", str) != 0)
                                {
                                    ff_printf(" {--invalid time value--}\n");
                                }
                                else
                                {
                                    ff_printf(" %s\n", str);
                                }
                            }
                        }
                        break;
                    case coda_special_complex:
                        {
                            double re, im;

                            if (coda_cursor_read_complex_double_split(cursor, &re, &im) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf(" %g + %gi\n", re, im);
                        }
                        break;
                }
            }
            break;
    }
}